

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Node __thiscall xt::vector::doAssoc(vector *this,uint level,Node *node,uint i,Object *val)

{
  uint i_00;
  uint level_00;
  _Node *this_00;
  __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var1;
  element_type *peVar2;
  reference pvVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Node NVar5;
  Object local_100;
  Object local_e0;
  undefined1 local_c0 [16];
  shared_ptr<xt::_Node> local_b0;
  Object local_a0;
  uint local_7c;
  __normal_iterator<xt::Object_*,_std::vector<xt::Object,_std::allocator<xt::Object>_>_> _Stack_78;
  uint subidx;
  Object *local_70;
  __normal_iterator<xt::Object_*,_std::vector<xt::Object,_std::allocator<xt::Object>_>_> local_68;
  __normal_iterator<xt::Object_*,_std::vector<xt::Object,_std::allocator<xt::Object>_>_> local_60;
  undefined1 local_55;
  ObjectArray local_48;
  undefined1 local_31;
  Object *local_30;
  Object *val_local;
  Node *pNStack_20;
  uint i_local;
  Node *node_local;
  vector *pvStack_10;
  uint level_local;
  Node *ret;
  
  local_31 = 0;
  local_30 = val;
  val_local._4_4_ = i;
  pNStack_20 = node;
  node_local._4_4_ = level;
  pvStack_10 = this;
  this_00 = (_Node *)operator_new(0x10);
  local_55 = 1;
  new_object_array((xt *)&local_48,0x20);
  _Node::_Node(this_00,&local_48);
  local_55 = 0;
  std::shared_ptr<xt::_Node>::shared_ptr<xt::_Node,void>((shared_ptr<xt::_Node> *)this,this_00);
  std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::~shared_ptr(&local_48);
  p_Var1 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )node);
  peVar2 = std::
           __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  local_60._M_current =
       (Object *)std::vector<xt::Object,_std::allocator<xt::Object>_>::begin(peVar2);
  p_Var1 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )node);
  peVar2 = std::
           __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  local_68._M_current = (Object *)std::vector<xt::Object,_std::allocator<xt::Object>_>::end(peVar2);
  p_Var1 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )this);
  peVar2 = std::
           __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  local_70 = (Object *)std::vector<xt::Object,_std::allocator<xt::Object>_>::begin(peVar2);
  _Stack_78 = std::
              copy<__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>,__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>>
                        (local_60,local_68,
                         (__normal_iterator<xt::Object_*,_std::vector<xt::Object,_std::allocator<xt::Object>_>_>
                          )local_70);
  if (node_local._4_4_ == 0) {
    p_Var1 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    peVar2 = std::
             __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(p_Var1);
    pvVar3 = std::vector<xt::Object,_std::allocator<xt::Object>_>::operator[]
                       (peVar2,(ulong)(val_local._4_4_ & 0x1f));
    Object::operator=(pvVar3,val);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    local_7c = val_local._4_4_ >> (node_local._4_1_ & 0x1f) & 0x1f;
    level_00 = node_local._4_4_ - 5;
    p_Var1 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)node);
    peVar2 = std::
             __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(p_Var1);
    pvVar3 = std::vector<xt::Object,_std::allocator<xt::Object>_>::operator[]
                       (peVar2,(ulong)local_7c);
    Object::Object(&local_e0,pvVar3);
    to_node((Object *)local_c0);
    i_00 = val_local._4_4_;
    Object::Object(&local_100,val);
    doAssoc((vector *)&local_b0,level_00,(Node *)local_c0,i_00,&local_100);
    Object::Object<xt::_Node>(&local_a0,&local_b0);
    p_Var1 = (__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<xt::_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    peVar2 = std::
             __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(p_Var1);
    pvVar3 = std::vector<xt::Object,_std::allocator<xt::Object>_>::operator[]
                       (peVar2,(ulong)local_7c);
    Object::operator=(pvVar3,&local_a0);
    Object::~Object(&local_a0);
    std::shared_ptr<xt::_Node>::~shared_ptr(&local_b0);
    Object::~Object(&local_100);
    std::shared_ptr<xt::_Node>::~shared_ptr((shared_ptr<xt::_Node> *)local_c0);
    Object::~Object(&local_e0);
    _Var4._M_pi = extraout_RDX_00;
  }
  NVar5.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  NVar5.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar5.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node doAssoc(unsigned int level, Node node, unsigned int i, Object val) {
	Node ret = Node(new _Node {new_object_array(32)});
	std::copy(node->array->begin(), node->array->end(), ret->array->begin());
	if (level == 0)
		(*ret->array)[i & 0x01f] = val;
	else {
		unsigned int subidx = (i >> level) & 0x01f;
		(*ret->array)[subidx] = doAssoc(level - 5, to_node((*node->array)[subidx]), i, val);
	}
	return ret;
}